

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unordered_map.cpp
# Opt level: O3

bool operator==(string self,case_insensitive other)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  undefined2 local_2c;
  char local_2a;
  
  local_2c = other.data._0_2_;
  local_2a = other.data[2];
  if (self.size_ == 3) {
    lVar4 = 0;
    do {
      cVar1 = *(char *)((long)&local_2c + lVar4);
      iVar2 = tolower((int)self.data_[lVar4]);
      iVar3 = tolower((int)cVar1);
      bVar5 = iVar2 == iVar3;
      if (!bVar5) {
        return bVar5;
      }
      bVar6 = lVar4 != 2;
      lVar4 = lVar4 + 1;
    } while (bVar6);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator==(frozen::string self, case_insensitive other) {
    return std::equal(self.begin(), self.end(), other.data, other.data + 3,
        [](char s, char o) { return std::tolower(s) == std::tolower(o);});
  }